

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall HighsHashTable<int,_void>::~HighsHashTable(HighsHashTable<int,_void> *this)

{
  unique_ptr<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter> *in_RDI;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *unaff_retaddr;
  
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (unaff_retaddr);
  std::unique_ptr<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>::
  ~unique_ptr(in_RDI);
  return;
}

Assistant:

~HighsHashTable() {
    if (!std::is_trivially_destructible<Entry>::value && metadata) {
      u64 capacity = tableSizeMask + 1;
      for (u64 i = 0; i < capacity; ++i) {
        if (occupied(metadata[i])) entries.get()[i].~Entry();
      }
    }
  }